

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Var.cpp
# Opt level: O0

void __thiscall asl::Var::free(Var *this,void *__ptr)

{
  Type TVar1;
  Var *this_local;
  
  TVar1 = this->_type;
  if (TVar1 == STRING) {
    StaticSpace<asl::Array<char>_>::destroy(&(this->field_1)._s);
  }
  else if (TVar1 == ARRAY) {
    StaticSpace<asl::Array<asl::Var>_>::destroy(&(this->field_1)._a);
  }
  else if (TVar1 == DIC) {
    StaticSpace<asl::Dic<asl::Var>_>::destroy(&(this->field_1)._o);
  }
  this->_type = NONE;
  return;
}

Assistant:

void Var::free()
{
	switch(_type) {
	case STRING: DEL_STRING(_s); break;
	case ARRAY: DEL_ARRAY(_a); break;
	case OBJ: DEL_DIC(_o); break;
	default: break;
	}
	_type=NONE;
}